

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O2

reference __thiscall
slang::
SmallVectorBase<std::unique_ptr<slang::parsing::Lexer,std::default_delete<slang::parsing::Lexer>>>::
emplace_back<std::unique_ptr<slang::parsing::Lexer,std::default_delete<slang::parsing::Lexer>>>
          (SmallVectorBase<std::unique_ptr<slang::parsing::Lexer,std::default_delete<slang::parsing::Lexer>>>
           *this,unique_ptr<slang::parsing::Lexer,_std::default_delete<slang::parsing::Lexer>_>
                 *args)

{
  long lVar1;
  ulong uVar2;
  move_iterator<std::unique_ptr<slang::parsing::Lexer,_std::default_delete<slang::parsing::Lexer>_>_*>
  __first;
  unique_ptr<slang::parsing::Lexer,_std::default_delete<slang::parsing::Lexer>_> *__result;
  reference puVar3;
  ulong uVar4;
  move_iterator<std::unique_ptr<slang::parsing::Lexer,_std::default_delete<slang::parsing::Lexer>_>_*>
  __last;
  move_iterator<std::unique_ptr<slang::parsing::Lexer,_std::default_delete<slang::parsing::Lexer>_>_*>
  __last_00;
  
  lVar1 = *(long *)(this + 8);
  __last._M_current =
       (unique_ptr<slang::parsing::Lexer,_std::default_delete<slang::parsing::Lexer>_> *)
       (lVar1 * 8 + *(long *)this);
  if (lVar1 != *(long *)(this + 0x10)) {
    ((__last._M_current)->_M_t).
    super___uniq_ptr_impl<slang::parsing::Lexer,_std::default_delete<slang::parsing::Lexer>_>._M_t.
    super__Tuple_impl<0UL,_slang::parsing::Lexer_*,_std::default_delete<slang::parsing::Lexer>_>.
    super__Head_base<0UL,_slang::parsing::Lexer_*,_false>._M_head_impl =
         (args->_M_t).
         super___uniq_ptr_impl<slang::parsing::Lexer,_std::default_delete<slang::parsing::Lexer>_>.
         _M_t.
         super__Tuple_impl<0UL,_slang::parsing::Lexer_*,_std::default_delete<slang::parsing::Lexer>_>
         .super__Head_base<0UL,_slang::parsing::Lexer_*,_false>._M_head_impl;
    (args->_M_t).
    super___uniq_ptr_impl<slang::parsing::Lexer,_std::default_delete<slang::parsing::Lexer>_>._M_t.
    super__Tuple_impl<0UL,_slang::parsing::Lexer_*,_std::default_delete<slang::parsing::Lexer>_>.
    super__Head_base<0UL,_slang::parsing::Lexer_*,_false>._M_head_impl = (Lexer *)0x0;
    *(long *)(this + 8) = lVar1 + 1;
    return (reference)(*(long *)this + lVar1 * 8);
  }
  if (*(long *)(this + 8) != 0xfffffffffffffff) {
    uVar4 = *(long *)(this + 8) + 1;
    uVar2 = *(ulong *)(this + 0x10);
    if (uVar4 < uVar2 * 2) {
      uVar4 = uVar2 * 2;
    }
    if (0xfffffffffffffff - uVar2 < uVar2) {
      uVar4 = 0xfffffffffffffff;
    }
    lVar1 = *(long *)this;
    __result = (unique_ptr<slang::parsing::Lexer,_std::default_delete<slang::parsing::Lexer>_> *)
               operator_new(uVar4 * 8);
    puVar3 = (reference)((long)__result + ((long)__last._M_current - lVar1));
    *(Lexer **)((long)__result + ((long)__last._M_current - lVar1)) =
         (args->_M_t).
         super___uniq_ptr_impl<slang::parsing::Lexer,_std::default_delete<slang::parsing::Lexer>_>.
         _M_t.
         super__Tuple_impl<0UL,_slang::parsing::Lexer_*,_std::default_delete<slang::parsing::Lexer>_>
         .super__Head_base<0UL,_slang::parsing::Lexer_*,_false>._M_head_impl;
    (args->_M_t).
    super___uniq_ptr_impl<slang::parsing::Lexer,_std::default_delete<slang::parsing::Lexer>_>._M_t.
    super__Tuple_impl<0UL,_slang::parsing::Lexer_*,_std::default_delete<slang::parsing::Lexer>_>.
    super__Head_base<0UL,_slang::parsing::Lexer_*,_false>._M_head_impl = (Lexer *)0x0;
    __first._M_current =
         *(unique_ptr<slang::parsing::Lexer,_std::default_delete<slang::parsing::Lexer>_> **)this;
    __last_00._M_current = __first._M_current + *(long *)(this + 8);
    if (__last_00._M_current == __last._M_current) {
      std::__uninitialized_copy<false>::
      __uninit_copy<std::move_iterator<std::unique_ptr<slang::parsing::Lexer,std::default_delete<slang::parsing::Lexer>>*>,std::unique_ptr<slang::parsing::Lexer,std::default_delete<slang::parsing::Lexer>>*>
                (__first,__last_00,__result);
    }
    else {
      std::__uninitialized_copy<false>::
      __uninit_copy<std::move_iterator<std::unique_ptr<slang::parsing::Lexer,std::default_delete<slang::parsing::Lexer>>*>,std::unique_ptr<slang::parsing::Lexer,std::default_delete<slang::parsing::Lexer>>*>
                (__first,__last,__result);
      __last_00._M_current =
           (unique_ptr<slang::parsing::Lexer,_std::default_delete<slang::parsing::Lexer>_> *)
           (*(long *)(this + 8) * 8 + *(long *)this);
      std::__uninitialized_copy<false>::
      __uninit_copy<std::move_iterator<std::unique_ptr<slang::parsing::Lexer,std::default_delete<slang::parsing::Lexer>>*>,std::unique_ptr<slang::parsing::Lexer,std::default_delete<slang::parsing::Lexer>>*>
                (__last,__last_00,puVar3 + 1);
    }
    SmallVectorBase<std::unique_ptr<slang::parsing::Lexer,_std::default_delete<slang::parsing::Lexer>_>_>
    ::cleanup((SmallVectorBase<std::unique_ptr<slang::parsing::Lexer,_std::default_delete<slang::parsing::Lexer>_>_>
               *)this,(EVP_PKEY_CTX *)__last_00._M_current);
    *(long *)(this + 8) = *(long *)(this + 8) + 1;
    *(ulong *)(this + 0x10) = uVar4;
    *(unique_ptr<slang::parsing::Lexer,_std::default_delete<slang::parsing::Lexer>_> **)this =
         __result;
    return puVar3;
  }
  detail::throwLengthError();
}

Assistant:

reference emplace_back(Args&&... args) {
        if (len == cap)
            return *emplaceRealloc(end(), std::forward<Args>(args)...);

        new (end()) T(std::forward<Args>(args)...);
        len++;
        return back();
    }